

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void convertToWithoutRowidTable(Parse *pParse,Table *pTab)

{
  long lVar1;
  sqlite3_vfs *psVar2;
  CollSeq *pCVar3;
  uint nCol;
  int iVar4;
  ExprList *pEVar5;
  Table *in_RSI;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  int n;
  ExprList *pList;
  Vdbe *v;
  sqlite3 *db;
  int j;
  int i;
  int nExtra;
  int nPk;
  Index *pPk;
  Index *pIdx;
  Token ipkToken;
  SrcList *in_stack_00000090;
  Token *in_stack_00000098;
  Token *in_stack_000000a0;
  Parse *in_stack_000000a8;
  Token *in_stack_00000140;
  Expr *in_stack_00000148;
  int in_stack_00000150;
  int in_stack_00000158;
  u8 in_stack_00000160;
  Expr *in_stack_ffffffffffffff68;
  Vdbe *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int local_64;
  uint local_48;
  int local_44;
  Index *local_38;
  Index *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = in_RDI->pVfs;
  pCVar3 = in_RDI->pDfltColl;
  if ((*(byte *)((long)&psVar2[1].zName + 6) >> 1 & 1) == 0) {
    for (local_44 = 0; local_44 < in_RSI->nCol; local_44 = local_44 + 1) {
      if (((in_RSI->aCol[local_44].colFlags & 1) != 0) &&
         ((in_RSI->aCol[local_44].field_0x8 & 0xf) == 0)) {
        in_RSI->aCol[local_44].field_0x8 = in_RSI->aCol[local_44].field_0x8 & 0xf0 | 2;
      }
    }
    in_RSI->tabFlags = in_RSI->tabFlags | 0x800;
  }
  if (in_RDI->nVdbeActive != 0) {
    sqlite3VdbeChangeP3(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                        (int)in_stack_ffffffffffffff68);
  }
  if (in_RSI->iPKey < 0) {
    local_38 = sqlite3PrimaryKeyIndex(in_RSI);
    local_48 = 1;
    for (local_44 = 1; local_44 < (int)(uint)local_38->nKeyCol; local_44 = local_44 + 1) {
      iVar4 = isDupColumn((Index *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          in_stack_ffffffffffffff84,
                          (Index *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      if (iVar4 == 0) {
        local_38->azColl[(int)local_48] = local_38->azColl[local_44];
        local_38->aSortOrder[(int)local_48] = local_38->aSortOrder[local_44];
        local_38->aiColumn[(int)local_48] = local_38->aiColumn[local_44];
        local_48 = local_48 + 1;
      }
      else {
        local_38->nColumn = local_38->nColumn - 1;
      }
    }
    local_38->nKeyCol = (u16)local_48;
  }
  else {
    sqlite3TokenInit((Token *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    sqlite3ExprAlloc(in_RDI,in_stack_ffffffffffffff8c,
                     (Token *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff7c);
    pEVar5 = sqlite3ExprListAppend
                       ((Parse *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (ExprList *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (pEVar5 == (ExprList *)0x0) {
      in_RSI->tabFlags = in_RSI->tabFlags & 0xffffff7f;
      goto LAB_001d6bea;
    }
    if (1 < *(byte *)((long)&in_RDI->pUpdateArg + 4)) {
      sqlite3RenameTokenRemap((Parse *)in_RDI,pEVar5->a[0].pExpr,&in_RSI->iPKey);
    }
    pEVar5->a[0].fg.sortFlags = *(u8 *)((long)&in_RDI->pUpdateArg + 2);
    in_RSI->iPKey = -1;
    in_stack_ffffffffffffff68 = (Expr *)0x0;
    in_stack_ffffffffffffff70 = (Vdbe *)0x0;
    in_stack_ffffffffffffff78 = 0;
    in_stack_ffffffffffffff80 = 0;
    in_stack_ffffffffffffff88 = 2;
    sqlite3CreateIndex(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090,
                       (ExprList *)ipkToken._8_8_,ipkToken.z._4_4_,in_stack_00000140,
                       in_stack_00000148,in_stack_00000150,in_stack_00000158,in_stack_00000160);
    if (*(int *)((long)&in_RDI->flags + 4) != 0) {
      in_RSI->tabFlags = in_RSI->tabFlags & 0xffffff7f;
      goto LAB_001d6bea;
    }
    local_38 = sqlite3PrimaryKeyIndex(in_RSI);
  }
  *(ushort *)&local_38->field_0x63 = *(ushort *)&local_38->field_0x63 & 0xffdf | 0x20;
  if ((*(byte *)((long)&psVar2[1].zName + 6) >> 1 & 1) == 0) {
    *(ushort *)&local_38->field_0x63 = *(ushort *)&local_38->field_0x63 & 0xfff7 | 8;
  }
  local_38->nColumn = local_38->nKeyCol;
  nCol = (uint)local_38->nKeyCol;
  if ((pCVar3 != (CollSeq *)0x0) && (local_38->tnum != 0)) {
    sqlite3VdbeChangeOpcode
              (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               (u8)((ulong)in_stack_ffffffffffffff68 >> 0x18));
  }
  local_38->tnum = in_RSI->tnum;
  for (local_30 = in_RSI->pIndex; local_30 != (Index *)0x0; local_30 = local_30->pNext) {
    if ((*(ushort *)&local_30->field_0x63 & 3) != 2) {
      local_64 = 0;
      for (local_44 = 0; local_44 < (int)nCol; local_44 = local_44 + 1) {
        iVar4 = isDupColumn((Index *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                            in_stack_ffffffffffffff84,
                            (Index *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                            (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
        if (iVar4 == 0) {
          local_64 = local_64 + 1;
        }
      }
      if (local_64 == 0) {
        local_30->nColumn = local_30->nKeyCol;
      }
      else {
        iVar4 = resizeIndexObject((sqlite3 *)
                                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                  (Index *)CONCAT44(in_stack_ffffffffffffff84,
                                                    in_stack_ffffffffffffff80),
                                  in_stack_ffffffffffffff7c);
        if (iVar4 != 0) goto LAB_001d6bea;
        local_44 = 0;
        local_48 = (uint)local_30->nKeyCol;
        for (; local_44 < (int)nCol; local_44 = local_44 + 1) {
          iVar4 = isDupColumn((Index *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                              ,in_stack_ffffffffffffff84,
                              (Index *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                              ,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
          if (iVar4 == 0) {
            local_30->aiColumn[(int)local_48] = local_38->aiColumn[local_44];
            local_30->azColl[(int)local_48] = local_38->azColl[local_44];
            if (local_38->aSortOrder[local_44] != '\0') {
              *(ushort *)&local_30->field_0x63 = *(ushort *)&local_30->field_0x63 & 0xfbff | 0x400;
            }
            local_48 = local_48 + 1;
          }
        }
      }
    }
  }
  for (local_44 = 0; local_44 < in_RSI->nCol; local_44 = local_44 + 1) {
    hasColumn(local_38->aiColumn,nCol,local_44);
  }
  iVar4 = resizeIndexObject((sqlite3 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                            ,(Index *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff7c);
  if (iVar4 == 0) {
    local_48 = nCol;
    for (local_44 = 0; local_44 < in_RSI->nCol; local_44 = local_44 + 1) {
      iVar4 = hasColumn(local_38->aiColumn,local_48,local_44);
      if ((iVar4 == 0) && ((in_RSI->aCol[local_44].colFlags & 0x20) == 0)) {
        local_38->aiColumn[(int)local_48] = (i16)local_44;
        local_38->azColl[(int)local_48] = "BINARY";
        local_48 = local_48 + 1;
      }
    }
    recomputeColumnsNotIndexed(local_38);
  }
LAB_001d6bea:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void convertToWithoutRowidTable(Parse *pParse, Table *pTab){
  Index *pIdx;
  Index *pPk;
  int nPk;
  int nExtra;
  int i, j;
  sqlite3 *db = pParse->db;
  Vdbe *v = pParse->pVdbe;

  /* Mark every PRIMARY KEY column as NOT NULL (except for imposter tables)
  */
  if( !db->init.imposterTable ){
    for(i=0; i<pTab->nCol; i++){
      if( (pTab->aCol[i].colFlags & COLFLAG_PRIMKEY)!=0
       && (pTab->aCol[i].notNull==OE_None)
      ){
        pTab->aCol[i].notNull = OE_Abort;
      }
    }
    pTab->tabFlags |= TF_HasNotNull;
  }

  /* Convert the P3 operand of the OP_CreateBtree opcode from BTREE_INTKEY
  ** into BTREE_BLOBKEY.
  */
  assert( !pParse->bReturning );
  if( pParse->u1.addrCrTab ){
    assert( v );
    sqlite3VdbeChangeP3(v, pParse->u1.addrCrTab, BTREE_BLOBKEY);
  }

  /* Locate the PRIMARY KEY index.  Or, if this table was originally
  ** an INTEGER PRIMARY KEY table, create a new PRIMARY KEY index.
  */
  if( pTab->iPKey>=0 ){
    ExprList *pList;
    Token ipkToken;
    sqlite3TokenInit(&ipkToken, pTab->aCol[pTab->iPKey].zCnName);
    pList = sqlite3ExprListAppend(pParse, 0,
                  sqlite3ExprAlloc(db, TK_ID, &ipkToken, 0));
    if( pList==0 ){
      pTab->tabFlags &= ~TF_WithoutRowid;
      return;
    }
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenRemap(pParse, pList->a[0].pExpr, &pTab->iPKey);
    }
    pList->a[0].fg.sortFlags = pParse->iPkSortOrder;
    assert( pParse->pNewTable==pTab );
    pTab->iPKey = -1;
    sqlite3CreateIndex(pParse, 0, 0, 0, pList, pTab->keyConf, 0, 0, 0, 0,
                       SQLITE_IDXTYPE_PRIMARYKEY);
    if( pParse->nErr ){
      pTab->tabFlags &= ~TF_WithoutRowid;
      return;
    }
    assert( db->mallocFailed==0 );
    pPk = sqlite3PrimaryKeyIndex(pTab);
    assert( pPk->nKeyCol==1 );
  }else{
    pPk = sqlite3PrimaryKeyIndex(pTab);
    assert( pPk!=0 );

    /*
    ** Remove all redundant columns from the PRIMARY KEY.  For example, change
    ** "PRIMARY KEY(a,b,a,b,c,b,c,d)" into just "PRIMARY KEY(a,b,c,d)".  Later
    ** code assumes the PRIMARY KEY contains no repeated columns.
    */
    for(i=j=1; i<pPk->nKeyCol; i++){
      if( isDupColumn(pPk, j, pPk, i) ){
        pPk->nColumn--;
      }else{
        testcase( hasColumn(pPk->aiColumn, j, pPk->aiColumn[i]) );
        pPk->azColl[j] = pPk->azColl[i];
        pPk->aSortOrder[j] = pPk->aSortOrder[i];
        pPk->aiColumn[j++] = pPk->aiColumn[i];
      }
    }
    pPk->nKeyCol = j;
  }
  assert( pPk!=0 );
  pPk->isCovering = 1;
  if( !db->init.imposterTable ) pPk->uniqNotNull = 1;
  nPk = pPk->nColumn = pPk->nKeyCol;

  /* Bypass the creation of the PRIMARY KEY btree and the sqlite_schema
  ** table entry. This is only required if currently generating VDBE
  ** code for a CREATE TABLE (not when parsing one as part of reading
  ** a database schema).  */
  if( v && pPk->tnum>0 ){
    assert( db->init.busy==0 );
    sqlite3VdbeChangeOpcode(v, (int)pPk->tnum, OP_Goto);
  }

  /* The root page of the PRIMARY KEY is the table root page */
  pPk->tnum = pTab->tnum;

  /* Update the in-memory representation of all UNIQUE indices by converting
  ** the final rowid column into one or more columns of the PRIMARY KEY.
  */
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int n;
    if( IsPrimaryKeyIndex(pIdx) ) continue;
    for(i=n=0; i<nPk; i++){
      if( !isDupColumn(pIdx, pIdx->nKeyCol, pPk, i) ){
        testcase( hasColumn(pIdx->aiColumn, pIdx->nKeyCol, pPk->aiColumn[i]) );
        n++;
      }
    }
    if( n==0 ){
      /* This index is a superset of the primary key */
      pIdx->nColumn = pIdx->nKeyCol;
      continue;
    }
    if( resizeIndexObject(db, pIdx, pIdx->nKeyCol+n) ) return;
    for(i=0, j=pIdx->nKeyCol; i<nPk; i++){
      if( !isDupColumn(pIdx, pIdx->nKeyCol, pPk, i) ){
        testcase( hasColumn(pIdx->aiColumn, pIdx->nKeyCol, pPk->aiColumn[i]) );
        pIdx->aiColumn[j] = pPk->aiColumn[i];
        pIdx->azColl[j] = pPk->azColl[i];
        if( pPk->aSortOrder[i] ){
          /* See ticket https://www.sqlite.org/src/info/bba7b69f9849b5bf */
          pIdx->bAscKeyBug = 1;
        }
        j++;
      }
    }
    assert( pIdx->nColumn>=pIdx->nKeyCol+n );
    assert( pIdx->nColumn>=j );
  }

  /* Add all table columns to the PRIMARY KEY index
  */
  nExtra = 0;
  for(i=0; i<pTab->nCol; i++){
    if( !hasColumn(pPk->aiColumn, nPk, i)
     && (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0 ) nExtra++;
  }
  if( resizeIndexObject(db, pPk, nPk+nExtra) ) return;
  for(i=0, j=nPk; i<pTab->nCol; i++){
    if( !hasColumn(pPk->aiColumn, j, i)
     && (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0
    ){
      assert( j<pPk->nColumn );
      pPk->aiColumn[j] = i;
      pPk->azColl[j] = sqlite3StrBINARY;
      j++;
    }
  }
  assert( pPk->nColumn==j );
  assert( pTab->nNVCol<=j );
  recomputeColumnsNotIndexed(pPk);
}